

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::SubroutineFunction
          (SubroutineFunction *this,SubroutineFunction *param_1)

{
  pointer pcVar1;
  NumSys NVar2;
  
  (this->index).super_LayoutSpecifierBase.occurence.occurence =
       (param_1->index).super_LayoutSpecifierBase.occurence.occurence;
  NVar2 = (param_1->index).super_LayoutSpecifierBase.numSys;
  (this->index).super_LayoutSpecifierBase.val = (param_1->index).super_LayoutSpecifierBase.val;
  (this->index).super_LayoutSpecifierBase.numSys = NVar2;
  std::vector<float,_std::allocator<float>_>::vector
            (&(this->embeddedRetVal).fValues,&(param_1->embeddedRetVal).fValues);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->embeddedRetVal).iValues,&(param_1->embeddedRetVal).iValues);
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->embeddedRetVal).uValues,&(param_1->embeddedRetVal).uValues);
  UniformType::UniformType(&(this->embeddedRetVal).type,&(param_1->embeddedRetVal).type);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}